

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Query *query)

{
  pointer pQVar1;
  bool bVar2;
  ostream *poVar3;
  vector<Query,_std::allocator<Query>_> *pvVar4;
  runtime_error *this;
  char *pcVar5;
  Query *q;
  pointer query_00;
  string local_40;
  
  poVar3 = os;
  switch(query->type) {
  case PRIMITIVE:
    Query::as_string_repr_abi_cxx11_(&local_40,query);
    std::operator<<(os,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    return os;
  case AND:
    pcVar5 = "and(";
    break;
  case OR:
    pcVar5 = "or(";
    break;
  case MIN_OF:
    poVar3 = std::operator<<(os,"min_of(");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    pcVar5 = ", ";
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Unknown query type.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<(poVar3,pcVar5);
  pvVar4 = Query::as_queries(query);
  pQVar1 = (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (query_00 = (pvVar4->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
                  super__Vector_impl_data._M_start; query_00 != pQVar1; query_00 = query_00 + 1) {
    if (!bVar2) {
      std::operator<<(os,", ");
    }
    operator<<(os,query_00);
    bVar2 = false;
  }
  std::operator<<(os,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Query &query) {
    QueryType type = query.get_type();
    if (type == QueryType::AND || type == QueryType::OR ||
        type == QueryType::MIN_OF) {
        if (type == QueryType::AND) {
            os << "and(";
        } else if (type == QueryType::OR) {
            os << "or(";
        } else if (type == QueryType::MIN_OF) {
            os << "min_of(" << query.as_count() << ", ";
        }

        bool is_first = true;
        for (const auto &q : query.as_queries()) {
            if (!is_first) {
                os << ", ";
            }
            is_first = false;
            os << q;
        }
        os << ")";
    } else if (type == QueryType::PRIMITIVE) {
        os << query.as_string_repr();
    } else {
        throw std::runtime_error("Unknown query type.");
    }
    return os;
}